

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadReference(CrateReader *this,Reference *d)

{
  bool bVar1;
  ostream *poVar2;
  value_type *rhs;
  AssetPath local_a78;
  string local_a38;
  ostringstream local_a18 [8];
  ostringstream ss_e_4;
  undefined1 local_8a0 [8];
  CustomDataType customData;
  ostringstream local_850 [8];
  ostringstream ss_e_3;
  undefined1 local_6d8 [8];
  LayerOffset layerOffset;
  ostringstream local_6a8 [8];
  ostringstream ss_e_2;
  optional<tinyusdz::Path> local_528;
  undefined1 local_450 [8];
  optional<tinyusdz::Path> path;
  ostringstream local_358 [8];
  ostringstream ss_e_1;
  PathIndex local_1e0;
  undefined4 local_1dc;
  PathIndex index;
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  undefined1 local_40 [8];
  string assetPath;
  Reference *d_local;
  CrateReader *this_local;
  
  if (d == (Reference *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    assetPath.field_2._8_8_ = d;
    ::std::__cxx11::string::string((string *)local_40);
    bVar1 = ReadString(this,(string *)local_40);
    if (bVar1) {
      PathIndex::PathIndex(&local_1e0);
      bVar1 = ReadIndex(this,&local_1e0.super_Index);
      if (bVar1) {
        GetPath(&local_528,this,local_1e0.super_Index);
        nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
                  ((optional<tinyusdz::Path> *)local_450,&local_528);
        nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_528);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_450);
        if (bVar1) {
          LayerOffset::LayerOffset((LayerOffset *)local_6d8);
          bVar1 = ReadLayerOffset(this,(LayerOffset *)local_6d8);
          if (bVar1) {
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)local_8a0);
            this_local._7_1_ = ReadCustomData(this,(CustomDataType *)local_8a0);
            if (this_local._7_1_) {
              tinyusdz::value::AssetPath::AssetPath(&local_a78,(string *)local_40);
              tinyusdz::value::AssetPath::operator=((AssetPath *)assetPath.field_2._8_8_,&local_a78)
              ;
              tinyusdz::value::AssetPath::~AssetPath(&local_a78);
              rhs = nonstd::optional_lite::optional<tinyusdz::Path>::value
                              ((optional<tinyusdz::Path> *)local_450);
              Path::operator=((Path *)(assetPath.field_2._8_8_ + 0x40),rhs);
              *(undefined1 (*) [8])(assetPath.field_2._8_8_ + 0x110) = local_6d8;
              *(double *)(assetPath.field_2._8_8_ + 0x118) = layerOffset._offset;
              ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)(assetPath.field_2._8_8_ + 0x120),
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                           *)local_8a0);
              local_1dc = 1;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_a18);
              poVar2 = ::std::operator<<((ostream *)local_a18,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,"[Crate]");
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ReadReference");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3ff);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)local_a18,
                                         "Failed to read CustomData(Dict) in Reference ValueRep.");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_a38);
              ::std::__cxx11::string::~string((string *)&local_a38);
              local_1dc = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_a18);
            }
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_8a0);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_850);
            poVar2 = ::std::operator<<((ostream *)local_850,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[Crate]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReadReference");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3fa);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_850,
                                       "Failed to read LayerOffset in Reference ValueRep.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&customData._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::__cxx11::string::~string
                      ((string *)&customData._M_t._M_impl.super__Rb_tree_header._M_node_count);
            this_local._7_1_ = false;
            local_1dc = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_850);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_6a8);
          poVar2 = ::std::operator<<((ostream *)local_6a8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadReference");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f5);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_6a8,
                                     "Invalid Path index in Reference ValueRep.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&layerOffset._scale);
          ::std::__cxx11::string::~string((string *)&layerOffset._scale);
          this_local._7_1_ = false;
          local_1dc = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_6a8);
        }
        nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                  ((optional<tinyusdz::Path> *)local_450);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_358);
        poVar2 = ::std::operator<<((ostream *)local_358,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadReference");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3f0);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_358,
                                   "Failed to read primPath Index in Reference ValueRep.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)((long)&path.contained + 200));
        ::std::__cxx11::string::~string((string *)((long)&path.contained + 200));
        this_local._7_1_ = false;
        local_1dc = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_358);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar2 = ::std::operator<<((ostream *)local_1b8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadReference");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3eb);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1b8,
                                 "Failed to read assetPath in Reference ValueRep.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&index);
      ::std::__cxx11::string::~string((string *)&index);
      this_local._7_1_ = false;
      local_1dc = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadReference(Reference *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path
  // layerOffset : LayerOffset
  // customData : Dict

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read assetPath in Reference ValueRep.");
  }

  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read primPath Index in Reference ValueRep.");
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Reference ValueRep.");
  }

  LayerOffset layerOffset;
  if (!ReadLayerOffset(&layerOffset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read LayerOffset in Reference ValueRep.");
  }

  CustomDataType customData;
  if (!ReadCustomData(&customData)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read CustomData(Dict) in Reference ValueRep.");
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();
  d->layerOffset = layerOffset;
  d->customData = customData;

  return true;
}